

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeSetLinearSolverB(void *cvode_mem,int which,SUNLinearSolver LS,SUNMatrix A)

{
  undefined8 *__ptr;
  SUNMatrix in_RCX;
  SUNLinearSolver in_RDX;
  int in_ESI;
  CVodeMem in_RDI;
  int retval;
  CVLsMemB cvlsB_mem;
  void *cvodeB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMem local_40;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x7fc,"CVodeSetLinearSolverB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x805,"CVodeSetLinearSolverB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"Illegal attempt to call before calling CVodeAdjMalloc.");
    local_4 = -0x65;
  }
  else if (in_ESI < in_RDI->cv_adj_mem->ca_nbckpbs) {
    for (local_40 = in_RDI->cv_adj_mem->cvB_mem;
        (local_40 != (CVodeBMem)0x0 && (in_ESI != local_40->cv_index)); local_40 = local_40->cv_next
        ) {
    }
    __ptr = (undefined8 *)malloc(0x68);
    if (__ptr == (undefined8 *)0x0) {
      cvProcessError(in_RDI,-4,0x820,"CVodeSetLinearSolverB",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"A memory request failed.");
      local_4 = -4;
    }
    else {
      *__ptr = 0;
      __ptr[1] = 0;
      __ptr[2] = 0;
      __ptr[3] = 0;
      __ptr[4] = 0;
      __ptr[5] = 0;
      __ptr[8] = 0;
      __ptr[9] = 0;
      __ptr[10] = 0;
      __ptr[0xb] = 0;
      __ptr[0xc] = 0;
      if (local_40->cv_lfree != (_func_int_CVodeBMem *)0x0) {
        (*local_40->cv_lfree)(local_40);
      }
      local_40->cv_lmem = __ptr;
      local_40->cv_lfree = cvLsFreeB;
      local_4 = CVodeSetLinearSolver
                          ((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,in_RCX);
      if (local_4 != 0) {
        free(__ptr);
      }
    }
  }
  else {
    cvProcessError(in_RDI,-3,0x80e,"CVodeSetLinearSolverB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"Illegal value for which.");
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int CVodeSetLinearSolverB(void* cvode_mem, int which, SUNLinearSolver LS,
                          SUNMatrix A)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_CVMEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CVLS_NO_ADJ, __LINE__, __func__, __FILE__,
                   MSG_LS_NO_ADJ);
    return (CVLS_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSG_LS_BAD_WHICH);
    return (CVLS_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  /* Get memory for CVLsMemRecB */
  cvlsB_mem = NULL;
  cvlsB_mem = (CVLsMemB)malloc(sizeof(struct CVLsMemRecB));
  if (cvlsB_mem == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* initialize Jacobian and preconditioner functions */
  cvlsB_mem->jacB      = NULL;
  cvlsB_mem->jacBS     = NULL;
  cvlsB_mem->jtsetupB  = NULL;
  cvlsB_mem->jtsetupBS = NULL;
  cvlsB_mem->jtimesB   = NULL;
  cvlsB_mem->jtimesBS  = NULL;
  cvlsB_mem->psetB     = NULL;
  cvlsB_mem->psetBS    = NULL;
  cvlsB_mem->psolveB   = NULL;
  cvlsB_mem->psolveBS  = NULL;
  cvlsB_mem->P_dataB   = NULL;

  /* free any existing system solver attached to cvB */
  if (cvB_mem->cv_lfree) { cvB_mem->cv_lfree(cvB_mem); }

  /* Attach lmemB data and lfreeB function. */
  cvB_mem->cv_lmem  = cvlsB_mem;
  cvB_mem->cv_lfree = cvLsFreeB;

  /* set the linear solver for this backward problem */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);
  retval     = CVodeSetLinearSolver(cvodeB_mem, LS, A);
  if (retval != CVLS_SUCCESS)
  {
    free(cvlsB_mem);
    cvlsB_mem = NULL;
  }

  return (retval);
}